

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiprec_convolve_test_util.cc
# Opt level: O2

void __thiscall
libaom_test::AV1HighbdHiprecConvolve::AV1HighbdHiprecConvolveTest::RunCheckOutput
          (AV1HighbdHiprecConvolveTest *this,highbd_hiprec_convolve_func test_impl)

{
  int w;
  int h;
  int bd;
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  ParamType *pPVar6;
  WienerConvolveParams WVar7;
  ulong uVar8;
  uint8_t *dst;
  uint8_t *puVar9;
  uint kernel_type;
  uint32_t uVar10;
  uint8_t *src;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  SEARCH_METHODS *pSVar14;
  ACMRandom *rnd;
  long lVar15;
  long lVar16;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  InterpKernel hkernel;
  InterpKernel vkernel;
  AssertionResult gtest_ar_3;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output2;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> input;
  AssertHelper local_70;
  uint32_t local_68;
  uint32_t local_64;
  WienerConvolveParams conv_params;
  
  pPVar6 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  w = *(int *)&(pPVar6->
               super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
               ).
               super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
               .field_0x14;
  pPVar6 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  h = (pPVar6->
      super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
      ).
      super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
      .super__Head_base<1UL,_int,_false>._M_head_impl;
  pPVar6 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  uVar4 = *(uint *)&(pPVar6->
                    super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                    ).
                    super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                    .
                    super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                    .
                    super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                    .field_0xc;
  pPVar6 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  bd = (pPVar6->
       super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       ).
       super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .
       super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .
       super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .super__Head_base<3UL,_int,_false>._M_head_impl;
  WVar7.round_0 = bd + -7;
  WVar7.round_1 = 0x15 - bd;
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (10 < bd) {
    conv_params = WVar7;
  }
  input._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
       operator_new__(0x8000,(nothrow_t *)&std::nothrow);
  vkernel[0] = 0;
  vkernel[1] = 0;
  vkernel[2] = 0;
  vkernel[3] = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
            ((internal *)hkernel,"input","nullptr",&input,(void **)vkernel);
  if ((char)hkernel[0] == '\0') {
    testing::Message::Message((Message *)vkernel);
    if (hkernel._8_8_ == 0) {
      pSVar14 = "";
    }
    else {
      pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
               ,0x10c,(char *)pSVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (vkernel._0_8_ != 0) {
      (**(code **)(*(long *)vkernel._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(hkernel + 4));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(hkernel + 4));
    iVar3 = (w + 0xfU & 0xfffffff0) * h;
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar8 = (long)iVar3 * 2;
    }
    output._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
    super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
         operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    vkernel[0] = 0;
    vkernel[1] = 0;
    vkernel[2] = 0;
    vkernel[3] = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
              ((internal *)hkernel,"output","nullptr",&output,(void **)vkernel);
    if ((char)hkernel[0] == '\0') {
      testing::Message::Message((Message *)vkernel);
      if (hkernel._8_8_ == 0) {
        pSVar14 = "";
      }
      else {
        pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                 ,0x113,(char *)pSVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if (vkernel._0_8_ != 0) {
        (**(code **)(*(long *)vkernel._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hkernel + 4));
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hkernel + 4));
      output2._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
      super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
           operator_new__(uVar8,(nothrow_t *)&std::nothrow);
      vkernel[0] = 0;
      vkernel[1] = 0;
      vkernel[2] = 0;
      vkernel[3] = 0;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
                ((internal *)hkernel,"output2","nullptr",&output2,(void **)vkernel);
      if ((char)hkernel[0] == '\0') {
        testing::Message::Message((Message *)vkernel);
        if (hkernel._8_8_ == 0) {
          pSVar14 = "";
        }
        else {
          pSVar14 = *(SEARCH_METHODS **)hkernel._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                   ,0x115,(char *)pSVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
        this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(hkernel + 4);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
        if (vkernel._0_8_ != 0) {
          (**(code **)(*(long *)vkernel._0_8_ + 8))();
        }
LAB_004561cb:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_00);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(hkernel + 4));
        rnd = &this->rnd_;
        lVar15 = 0;
        for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 1) {
          for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 1) {
            uVar2 = ACMRandom::Rand16(rnd);
            *(uint16_t *)
             ((long)input._M_t.
                    super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                    .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl + lVar15 +
             lVar13 * 2) = uVar2 & ~(ushort)(-1 << ((byte)bd & 0x1f));
          }
          lVar15 = lVar15 + 0x100;
        }
        uVar8 = (ulong)input._M_t.
                       super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                       .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1;
        dst = (uint8_t *)
              ((ulong)output._M_t.
                      super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                      .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1);
        puVar9 = (uint8_t *)
                 ((ulong)output2._M_t.
                         super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                         .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1);
        uVar10 = 0x79 - h;
        local_64 = 0x79 - w;
        kernel_type = 0;
        uVar1 = h * w;
        if (h * w < 1) {
          uVar1 = kernel_type;
        }
        if ((int)uVar4 < 1) {
          uVar4 = kernel_type;
        }
        local_68 = uVar10;
        for (; kernel_type != 6; kernel_type = kernel_type + 1) {
          generate_kernels(rnd,hkernel,vkernel,kernel_type);
          for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
            uVar10 = testing::internal::Random::Generate(&rnd->random_,uVar10);
            uVar5 = testing::internal::Random::Generate(&rnd->random_,local_64);
            src = (uint8_t *)((long)(int)uVar5 + (long)(int)(uVar10 * 0x80 + 0x180) + uVar8 + 3);
            av1_highbd_wiener_convolve_add_src_c
                      (src,0x80,dst,(long)w,hkernel,0x10,vkernel,0x10,w,h,&conv_params,bd);
            (*test_impl)(src,0x80,puVar9,(long)w,hkernel,0x10,vkernel,0x10,w,h,&conv_params,bd);
            lVar15 = 0;
            for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
              testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                        ((internal *)&gtest_ar_3,"output[j]","output2[j]",
                         (unsigned_short *)
                         ((long)output._M_t.
                                super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl +
                         lVar15),(unsigned_short *)
                                 ((long)output2._M_t.
                                        super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                        .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl
                                 + lVar15));
              if (gtest_ar_3.success_ == false) {
                testing::Message::Message((Message *)&local_e0);
                std::operator<<((ostream *)(local_e0._M_head_impl + 0x10),"Pixel mismatch at index "
                               );
                std::ostream::operator<<(local_e0._M_head_impl + 0x10,(int)uVar11);
                std::operator<<((ostream *)(local_e0._M_head_impl + 0x10)," = (");
                uVar8 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
                std::ostream::operator<<(local_e0._M_head_impl + 0x10,(int)((long)uVar8 % (long)w));
                std::operator<<((ostream *)(local_e0._M_head_impl + 0x10),", ");
                std::ostream::operator<<(local_e0._M_head_impl + 0x10,(int)((long)uVar8 / (long)w));
                std::operator<<((ostream *)(local_e0._M_head_impl + 0x10),") on iteration ");
                std::ostream::operator<<(local_e0._M_head_impl + 0x10,uVar12);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pSVar14 = "";
                }
                else {
                  pSVar14 = *(SEARCH_METHODS **)
                             gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                           ,0x12e,(char *)pSVar14);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_e0);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_e0._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                }
                this_00 = &gtest_ar_3.message_;
                goto LAB_004561cb;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_3.message_);
              lVar15 = lVar15 + 2;
            }
            uVar10 = local_68;
          }
        }
      }
      std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
                (&output2);
    }
    std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr(&output);
  }
  std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr(&input);
  return;
}

Assistant:

void AV1HighbdHiprecConvolveTest::RunCheckOutput(
    highbd_hiprec_convolve_func test_impl) {
  const int w = 128, h = 128;
  const int out_w = GET_PARAM(0), out_h = GET_PARAM(1);
  const int num_iters = GET_PARAM(2);
  const int bd = GET_PARAM(3);
  int i, j;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bd);

  std::unique_ptr<uint16_t[]> input(new (std::nothrow) uint16_t[h * w]);
  ASSERT_NE(input, nullptr);

  // The AVX2 convolve functions always write rows with widths that are
  // multiples of 16. So to avoid a buffer overflow, we may need to pad
  // rows to a multiple of 16.
  int output_n = ALIGN_POWER_OF_TWO(out_w, 4) * out_h;
  std::unique_ptr<uint16_t[]> output(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output, nullptr);
  std::unique_ptr<uint16_t[]> output2(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output2, nullptr);

  // Generate random filter kernels
  DECLARE_ALIGNED(16, InterpKernel, hkernel);
  DECLARE_ALIGNED(16, InterpKernel, vkernel);

  for (i = 0; i < h; ++i)
    for (j = 0; j < w; ++j) input[i * w + j] = rnd_.Rand16() & ((1 << bd) - 1);

  uint8_t *input_ptr = CONVERT_TO_BYTEPTR(input.get());
  uint8_t *output_ptr = CONVERT_TO_BYTEPTR(output.get());
  uint8_t *output2_ptr = CONVERT_TO_BYTEPTR(output2.get());
  for (int kernel_type = 0; kernel_type < 6; kernel_type++) {
    generate_kernels(&rnd_, hkernel, vkernel, kernel_type);
    for (i = 0; i < num_iters; ++i) {
      // Choose random locations within the source block
      int offset_r = 3 + rnd_.PseudoUniform(h - out_h - 7);
      int offset_c = 3 + rnd_.PseudoUniform(w - out_w - 7);
      av1_highbd_wiener_convolve_add_src_c(
          input_ptr + offset_r * w + offset_c, w, output_ptr, out_w, hkernel,
          16, vkernel, 16, out_w, out_h, &conv_params, bd);
      test_impl(input_ptr + offset_r * w + offset_c, w, output2_ptr, out_w,
                hkernel, 16, vkernel, 16, out_w, out_h, &conv_params, bd);

      for (j = 0; j < out_w * out_h; ++j)
        ASSERT_EQ(output[j], output2[j])
            << "Pixel mismatch at index " << j << " = (" << (j % out_w) << ", "
            << (j / out_w) << ") on iteration " << i;
    }
  }
}